

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall ManyDoublesRoundtripTest::RunShard(ManyDoublesRoundtripTest *this,int shard)

{
  int *piVar1;
  LiteralType literal_type;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *message;
  AssertionResult gtest_ar;
  uint64_t bits;
  uint64_t new_bits;
  char buffer [100];
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  Message local_c8;
  int local_c0;
  int local_bc;
  AssertHelper local_b8;
  ulong local_b0;
  ManyDoublesRoundtripTest *local_a8;
  uint64_t local_a0;
  char local_98 [104];
  
  uVar5 = (ulong)(uint)shard;
  local_c0 = -1;
  local_bc = shard;
  local_a8 = this;
  while( true ) {
    uVar4 = (uint)uVar5;
    if ((local_bc == 0) && (iVar3 = (int)(uVar5 >> 0x18), iVar3 != local_c0)) {
      printf("value: 0x%08x (%d%%)\r",uVar5,
             (ulong)(uint)(int)(((double)uVar5 * 100.0) / 4294967295.0));
      fflush(_stdout);
      local_c0 = iVar3;
    }
    local_b0 = uVar5 << 0x20 | uVar5;
    wabt::WriteDoubleHex(local_98,100,local_b0);
    sVar2 = strlen(local_98);
    local_c8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    literal_type = Nan - ((local_b0 & 0xfffffffffffff) == 0);
    if ((~local_b0 & 0x7ff0000000000000) != 0) {
      literal_type = Hexfloat;
    }
    local_b8.data_._0_4_ = wabt::ParseDouble(literal_type,local_98,local_98 + (int)sVar2,&local_a0);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_d8,"Result::Ok",
               "ParseDouble(ClassifyDouble(bits), buffer, buffer + len, &new_bits)",
               (Enum *)&local_c8,(Result *)&local_b8);
    if (local_d8[0] == (internal)0x0) break;
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_d8,"new_bits","bits",&local_a0,&local_b0);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message(&local_c8);
      if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_d0->_M_dataplus)._M_p;
      }
      iVar3 = 0x100;
      goto LAB_0010ba90;
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
    piVar1 = &(local_a8->super_ThreadedTest).num_threads_;
    uVar5 = (ulong)(uVar4 + *piVar1);
    if (CARRY4(uVar4,*piVar1)) {
      if (local_bc == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  }
  testing::Message::Message(&local_c8);
  if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = (local_d0->_M_dataplus)._M_p;
  }
  iVar3 = 0xff;
LAB_0010ba90:
  testing::internal::AssertHelper::AssertHelper
            (&local_b8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
             ,iVar3,message);
  testing::internal::AssertHelper::operator=(&local_b8,&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  if ((long *)CONCAT44(local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_d0,local_d0);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      WriteDoubleHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint64_t new_bits;
      ASSERT_EQ(Result::Ok, ParseDouble(ClassifyDouble(bits), buffer,
                                        buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }